

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pubkey.h
# Opt level: O3

void __thiscall CPubKey::Unserialize<DataStream>(CPubKey *this,DataStream *s)

{
  long lVar1;
  byte bVar2;
  uint uVar3;
  uint64_t uVar4;
  uint uVar5;
  size_t in_RCX;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar4 = ReadCompactSize<DataStream>(s,true);
  uVar3 = (uint)uVar4;
  if (uVar3 < 0x42) {
    DataStream::read(s,(int)this,(void *)(ulong)(uVar3 & 0x7f),in_RCX);
    uVar5 = 0x21;
    if ((this->vch[0] & 0xfe) != 2) {
      bVar2 = this->vch[0] - 4;
      uVar5 = 0;
      if (bVar2 < 4) {
        uVar5 = *(uint *)(&DAT_00e5e140 + (ulong)bVar2 * 4);
      }
    }
    if (uVar5 == uVar3) goto LAB_00419882;
  }
  else {
    DataStream::ignore(s,uVar4 & 0xffffffff);
  }
  this->vch[0] = 0xff;
LAB_00419882:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void Unserialize(Stream& s)
    {
        const unsigned int len(::ReadCompactSize(s));
        if (len <= SIZE) {
            s >> Span{vch, len};
            if (len != size()) {
                Invalidate();
            }
        } else {
            // invalid pubkey, skip available data
            s.ignore(len);
            Invalidate();
        }
    }